

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# perfetto.cc
# Opt level: O1

bool __thiscall
perfetto::protos::gen::DetachRequest::ParseFromArray(DetachRequest *this,void *raw,size_t size)

{
  byte bVar1;
  uint uVar2;
  Field *pFVar3;
  ulong uVar4;
  long lVar5;
  uint uVar6;
  Field *pFVar7;
  Field *pFVar8;
  Field *pFVar9;
  bool bVar10;
  ulong uVar11;
  ulong uVar12;
  ulong uVar13;
  Field *pFVar14;
  ulong uVar15;
  string *psVar16;
  bool bVar17;
  Field local_58;
  string *local_48;
  DetachRequest *local_40;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_38;
  
  local_38 = &this->unknown_fields_;
  (this->unknown_fields_)._M_string_length = 0;
  *(this->unknown_fields_)._M_dataplus._M_p = '\0';
  pFVar7 = (Field *)(size + (long)raw);
  do {
    lVar5 = 7;
    if (raw < pFVar7) {
      uVar12 = (ulong)(char)((Field *)raw)->int_value_;
      pFVar14 = (Field *)((long)&((Field *)raw)->int_value_ + 1);
      if ((long)uVar12 < 0) {
        bVar1 = (byte)((Field *)raw)->int_value_;
        uVar11 = (ulong)(bVar1 & 0x7f);
        bVar10 = false;
        pFVar9 = pFVar14;
        for (; (uVar12 = uVar11, pFVar8 = pFVar9, (char)bVar1 < '\0' &&
               (bVar17 = 0x38 < lVar5 - 7U, bVar10 = bVar17 || pFVar7 <= pFVar9, uVar12 = 0,
               pFVar8 = pFVar14, !bVar17 && pFVar7 > pFVar9)); lVar5 = lVar5 + 7) {
          bVar1 = (byte)pFVar9->int_value_;
          pFVar9 = (Field *)((long)&pFVar9->int_value_ + 1);
          uVar11 = uVar11 | (ulong)(bVar1 & 0x7f) << ((byte)lVar5 & 0x3f);
        }
        pFVar14 = pFVar8;
        if (bVar10) {
          pFVar14 = (Field *)raw;
          uVar12 = 0;
        }
        if (pFVar14 == (Field *)raw) goto LAB_002682bb;
      }
      bVar10 = false;
      uVar6 = (uint)(uVar12 >> 3);
      if ((uVar6 == 0) || (pFVar7 <= pFVar14)) {
switchD_00268049_caseD_3:
        uVar4 = 0;
        uVar11 = 0;
      }
      else {
        bVar10 = false;
        pFVar9 = (Field *)raw;
        switch((uint)uVar12 & 7) {
        case 0:
          uVar13 = 0;
          bVar10 = pFVar14 >= pFVar7;
          if (pFVar14 < pFVar7) {
            pFVar8 = (Field *)((long)&pFVar14->int_value_ + 1);
            bVar1 = (byte)pFVar14->int_value_;
            uVar4 = (ulong)(bVar1 & 0x7f);
            uVar11 = 0;
            pFVar9 = pFVar8;
            if ((char)bVar1 < '\0') {
              uVar2 = 0;
              lVar5 = 7;
              uVar4 = 0;
              uVar15 = uVar4;
              do {
                bVar10 = 0x38 < lVar5 - 7U || pFVar7 <= pFVar8;
                if (bVar10) {
                  uVar11 = (ulong)uVar2;
                  break;
                }
                bVar1 = (byte)pFVar8->int_value_;
                pFVar8 = (Field *)((long)&pFVar8->int_value_ + 1);
                uVar15 = uVar15 | (ulong)(bVar1 & 0x7f) << ((byte)lVar5 & 0x3f);
                uVar11 = uVar15 >> 0x20;
                lVar5 = lVar5 + 7;
                if ((char)bVar1 < '\0') {
                  uVar11 = (ulong)uVar2;
                }
                else {
                  uVar4 = uVar15 & 0xffffffff;
                  pFVar9 = pFVar8;
                }
                uVar2 = (uint)uVar11;
              } while ((char)bVar1 < '\0');
            }
          }
          else {
            uVar11 = 0;
            uVar4 = 0;
          }
          if (bVar10) {
            uVar11 = 0;
            pFVar9 = pFVar14;
            uVar4 = uVar13;
          }
          if (pFVar9 != pFVar14) goto LAB_002681fe;
          bVar10 = false;
          break;
        case 1:
          pFVar9 = (Field *)&pFVar14->size_;
          if (pFVar9 <= pFVar7) {
            uVar4 = pFVar14->int_value_;
            uVar11 = uVar4 >> 0x20;
            goto LAB_002680b1;
          }
          bVar10 = false;
          break;
        case 2:
          bVar10 = pFVar14 >= pFVar7;
          psVar16 = local_48;
          if (pFVar14 < pFVar7) {
            pFVar8 = (Field *)((long)&pFVar14->int_value_ + 1);
            bVar1 = (byte)pFVar14->int_value_;
            uVar11 = (ulong)(bVar1 & 0x7f);
            psVar16 = (string *)uVar11;
            pFVar9 = pFVar8;
            if ((char)bVar1 < '\0') {
              lVar5 = 7;
              pFVar3 = pFVar8;
              do {
                bVar10 = 0x38 < lVar5 - 7U || pFVar7 <= pFVar3;
                psVar16 = local_48;
                pFVar9 = pFVar8;
                if (bVar10) break;
                bVar1 = (byte)pFVar3->int_value_;
                pFVar3 = (Field *)((long)&pFVar3->int_value_ + 1);
                uVar11 = uVar11 | (ulong)(bVar1 & 0x7f) << ((byte)lVar5 & 0x3f);
                lVar5 = lVar5 + 7;
                psVar16 = (string *)uVar11;
                pFVar9 = pFVar3;
              } while ((char)bVar1 < '\0');
            }
          }
          local_48 = psVar16;
          if (bVar10) {
            pFVar9 = pFVar14;
            local_48 = (string *)0;
          }
          if ((pFVar9 == pFVar14) || ((ulong)((long)pFVar7 - (long)pFVar9) < local_48)) {
            uVar11 = 0;
            uVar4 = 0;
            bVar10 = false;
            uVar13 = 0;
          }
          else {
            uVar11 = (ulong)pFVar9 >> 0x20;
            uVar4 = (ulong)pFVar9 & 0xffffffff;
            pFVar9 = (Field *)((long)&pFVar9->int_value_ + (long)local_48);
            bVar10 = true;
            uVar13 = (ulong)local_48;
          }
          if (bVar10) goto LAB_002681fe;
          bVar10 = false;
          break;
        default:
          goto switchD_00268049_caseD_3;
        case 5:
          pFVar9 = (Field *)((long)&pFVar14->int_value_ + 4);
          uVar11 = 0;
          if (pFVar7 < pFVar9) {
            uVar4 = 0;
            bVar10 = false;
            goto LAB_002682d0;
          }
          uVar4 = (ulong)(uint)pFVar14->int_value_;
LAB_002680b1:
          uVar13 = 0;
LAB_002681fe:
          raw = pFVar9;
          bVar10 = true;
          if (uVar6 < 0x10000) {
            if (uVar13 < 0x10000000) {
              uVar4 = uVar4 & 0xffffffff | uVar11 << 0x20;
              uVar11 = uVar13 | (uVar12 >> 3) << 0x20 | (uVar12 & 7) << 0x30;
              bVar10 = false;
              goto LAB_002682d0;
            }
            goto switchD_00268049_caseD_3;
          }
        }
        uVar11 = 0;
        uVar4 = 0;
      }
    }
    else {
LAB_002682bb:
      uVar4 = 0;
      uVar11 = 0;
      bVar10 = false;
    }
LAB_002682d0:
    if (!bVar10) {
      local_48 = &this->key_;
      local_58.int_value_ = uVar4;
      local_40 = this;
      do {
        local_58.size_ = (uint32_t)uVar11;
        local_58.type_ = (uint8_t)(uVar11 >> 0x30);
        local_58.id_ = (uint16_t)(uVar11 >> 0x20);
        if (local_58.id_ == 1) {
          *(byte *)&(this->_has_field_).super__Base_bitset<1UL>._M_w =
               (byte)(this->_has_field_).super__Base_bitset<1UL>._M_w | 2;
          protozero::Field::get(&local_58,local_48);
        }
        else {
          if (local_58.id_ == 0) {
            return pFVar7 == (Field *)raw;
          }
          protozero::Field::SerializeAndAppendToInternal<std::__cxx11::string>(&local_58,local_38);
        }
        do {
          pFVar14 = &local_58;
          if (pFVar7 <= raw) {
LAB_002683eb:
            uVar11 = 0;
            bVar10 = false;
            local_58.int_value_ = 0;
            pFVar14 = (Field *)raw;
            goto LAB_00268684;
          }
          uVar12 = (ulong)(char)((Field *)raw)->int_value_;
          pFVar9 = (Field *)((long)&((Field *)raw)->int_value_ + 1);
          if ((long)uVar12 < 0) {
            bVar1 = (byte)((Field *)raw)->int_value_;
            uVar12 = (ulong)(bVar1 & 0x7f);
            bVar10 = false;
            pFVar8 = pFVar9;
            if ((char)bVar1 < '\0') {
              lVar5 = 7;
              uVar11 = uVar12;
              pFVar3 = pFVar9;
              do {
                bVar10 = 0x38 < lVar5 - 7U || pFVar7 <= pFVar3;
                uVar12 = 0;
                pFVar8 = pFVar9;
                if (bVar10) break;
                bVar1 = (byte)pFVar3->int_value_;
                pFVar8 = (Field *)((long)&pFVar3->int_value_ + 1);
                uVar12 = uVar11 | (ulong)(bVar1 & 0x7f) << ((byte)lVar5 & 0x3f);
                lVar5 = lVar5 + 7;
                uVar11 = uVar12;
                pFVar3 = pFVar8;
              } while ((char)bVar1 < '\0');
            }
            pFVar9 = pFVar8;
            if (bVar10) {
              pFVar9 = (Field *)raw;
              uVar12 = 0;
            }
            if (pFVar9 == (Field *)raw) goto LAB_002683eb;
          }
          uVar6 = (uint)(uVar12 >> 3);
          if ((uVar6 == 0) || (pFVar7 <= pFVar9)) {
switchD_00268482_caseD_3:
            bVar10 = false;
            uVar11 = 0;
            local_58.int_value_ = 0;
            pFVar14 = (Field *)raw;
            goto LAB_00268684;
          }
          switch((uint)uVar12 & 7) {
          case 0:
            uVar15 = 0;
            bVar10 = pFVar9 >= pFVar7;
            if (pFVar9 < pFVar7) {
              pFVar8 = (Field *)((long)&pFVar9->int_value_ + 1);
              bVar1 = (byte)pFVar9->int_value_;
              uVar2 = bVar1 & 0x7f;
              uVar11 = (ulong)uVar2;
              uVar13 = (ulong)uVar2;
              pFVar14 = pFVar8;
              uVar2 = 0;
              if ((char)bVar1 < '\0') {
                uVar13 = 0;
                lVar5 = 7;
                pFVar3 = pFVar8;
                do {
                  bVar17 = 0x38 < lVar5 - 7U;
                  bVar10 = bVar17 || pFVar7 <= pFVar3;
                  pFVar14 = pFVar8;
                  uVar2 = 0;
                  if (bVar17 || pFVar7 <= pFVar3) break;
                  bVar1 = (byte)pFVar3->int_value_;
                  pFVar3 = (Field *)((long)&pFVar3->int_value_ + 1);
                  uVar11 = uVar11 | (ulong)(bVar1 & 0x7f) << ((byte)lVar5 & 0x3f);
                  lVar5 = lVar5 + 7;
                  if (-1 < (char)bVar1) {
                    uVar13 = uVar11 & 0xffffffff;
                  }
                  pFVar14 = pFVar3;
                  uVar2 = (uint)(uVar11 >> 0x20);
                } while (-1 >= (char)bVar1);
              }
            }
            else {
              uVar13 = 0;
              uVar2 = 0;
            }
            if (bVar10) {
              uVar13 = uVar15;
            }
            uVar11 = (ulong)uVar2;
            if (bVar10) {
              pFVar14 = pFVar9;
              uVar11 = uVar15;
            }
            this = local_40;
            if (pFVar14 == pFVar9) {
              uVar11 = 0;
              bVar10 = false;
              local_58.int_value_ = uVar15;
              pFVar14 = (Field *)raw;
            }
            else {
LAB_0026863e:
              bVar10 = true;
              if ((uVar6 < 0x10000) && (uVar15 < 0x10000000)) {
                local_58.int_value_ = uVar13 & 0xffffffff | uVar11 << 0x20;
                uVar11 = uVar15 | (uVar12 >> 3) << 0x20 | (uVar12 & 7) << 0x30;
                bVar10 = false;
              }
              else {
                local_58.int_value_ = 0;
                uVar11 = 0;
              }
            }
            break;
          case 1:
            pFVar14 = (Field *)&pFVar9->size_;
            if (pFVar14 <= pFVar7) {
              uVar13 = pFVar9->int_value_;
              uVar11 = uVar13 >> 0x20;
LAB_002684e3:
              uVar15 = 0;
              goto LAB_0026863e;
            }
            goto LAB_00268425;
          case 2:
            bVar10 = pFVar9 >= pFVar7;
            uVar11 = uVar4;
            if (pFVar9 < pFVar7) {
              pFVar8 = (Field *)((long)&pFVar9->int_value_ + 1);
              bVar1 = (byte)pFVar9->int_value_;
              uVar13 = (ulong)(bVar1 & 0x7f);
              pFVar14 = pFVar8;
              uVar11 = uVar13;
              if ((char)bVar1 < '\0') {
                lVar5 = 7;
                pFVar3 = pFVar8;
                do {
                  bVar10 = 0x38 < lVar5 - 7U || pFVar7 <= pFVar3;
                  pFVar14 = pFVar8;
                  uVar11 = uVar4;
                  if (bVar10) break;
                  bVar1 = (byte)pFVar3->int_value_;
                  pFVar3 = (Field *)((long)&pFVar3->int_value_ + 1);
                  uVar13 = uVar13 | (ulong)(bVar1 & 0x7f) << ((byte)lVar5 & 0x3f);
                  lVar5 = lVar5 + 7;
                  pFVar14 = pFVar3;
                  uVar11 = uVar13;
                } while ((char)bVar1 < '\0');
              }
            }
            uVar4 = uVar11;
            if (bVar10) {
              pFVar14 = pFVar9;
              uVar4 = 0;
            }
            if ((pFVar14 == pFVar9) || ((ulong)((long)pFVar7 - (long)pFVar14) < uVar4)) {
              uVar13 = 0;
              uVar11 = 0;
              bVar10 = false;
              uVar15 = 0;
            }
            else {
              uVar11 = (ulong)pFVar14 >> 0x20;
              uVar13 = (ulong)pFVar14 & 0xffffffff;
              pFVar14 = (Field *)((long)&pFVar14->int_value_ + uVar4);
              bVar10 = true;
              uVar15 = uVar4;
            }
            if (bVar10) goto LAB_0026863e;
            uVar11 = 0;
            bVar10 = false;
            local_58.int_value_ = 0;
            pFVar14 = (Field *)raw;
            break;
          default:
            goto switchD_00268482_caseD_3;
          case 5:
            pFVar14 = (Field *)((long)&pFVar9->int_value_ + 4);
            uVar11 = 0;
            if (pFVar14 <= pFVar7) {
              uVar13 = (ulong)(uint)pFVar9->int_value_;
              goto LAB_002684e3;
            }
LAB_00268425:
            uVar11 = 0;
            bVar10 = false;
            local_58.int_value_ = 0;
            pFVar14 = (Field *)raw;
          }
LAB_00268684:
          raw = pFVar14;
        } while (bVar10);
      } while( true );
    }
  } while( true );
}

Assistant:

bool DetachRequest::ParseFromArray(const void* raw, size_t size) {
  unknown_fields_.clear();
  bool packed_error = false;

  ::protozero::ProtoDecoder dec(raw, size);
  for (auto field = dec.ReadField(); field.valid(); field = dec.ReadField()) {
    if (field.id() < _has_field_.size()) {
      _has_field_.set(field.id());
    }
    switch (field.id()) {
      case 1 /* key */:
        field.get(&key_);
        break;
      default:
        field.SerializeAndAppendTo(&unknown_fields_);
        break;
    }
  }
  return !packed_error && !dec.bytes_left();
}